

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessMessages
          (PeerManagerImpl *this,CNode *pfrom,atomic<bool> *interruptMsgProc)

{
  Txid *this_00;
  __int_type_conflict2 _Var1;
  long lVar2;
  _Elt_pointer pCVar3;
  _Elt_pointer pCVar4;
  element_type *peVar5;
  bool bVar6;
  Logger *pLVar7;
  int iVar8;
  Wtxid *this_01;
  byte bVar9;
  undefined1 uVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  Span<const_unsigned_char> __args_2;
  string_view logging_function;
  string_view logging_function_00;
  PeerRef peer;
  CTransactionRef porphanTx;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string local_178;
  undefined1 local_158 [32];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock109;
  undefined1 local_128 [16];
  optional<std::pair<CNetMessage,_bool>_> poll_result;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_80;
  bool local_68;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
  peVar5 = peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     ((pfrom->m_conn_type != INBOUND &&
      ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_outbound_version_message_sent != true)))) {
LAB_008f73e8:
    bVar9 = 0;
    goto LAB_008f73eb;
  }
  poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_recv.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_getdata_requests_mutex;
  poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ =
       poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
       super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
       super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ & 0xffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&poll_result);
  if ((peVar5->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (peVar5->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    ProcessGetData(this,pfrom,peVar5,interruptMsgProc);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&poll_result);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_owns = false;
  criticalblock2.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
  std::unique_lock<std::mutex>::lock(&criticalblock2.super_unique_lock);
  do {
    TxOrphanage::GetTxToReconsider((TxOrphanage *)&porphanTx,(NodeId)&this->m_orphanage);
    if (porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar8 = 3;
    }
    else {
      ChainstateManager::ProcessTransaction
                ((MempoolAcceptResult *)&poll_result,this->m_chainman,&porphanTx,false);
      this_00 = &(porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash;
      this_01 = &(porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_witness_hash;
      if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
          super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
          super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._0_4_ == 0) {
        pLVar7 = LogInstance();
        bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar7,TXPACKAGES,Debug);
        if (bVar6) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock109,this_00);
          base_blob<256u>::ToString_abi_cxx11_((string *)local_158,this_01);
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_00._M_len = 0x62;
          logging_function_00._M_str = "ProcessOrphanTx";
          logging_function_00._M_len = 0xf;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_00,source_file_00,0xd5c,TXPACKAGES,Debug,
                     (ConstevalFormatString<2U>)0xf9f702,(string *)&criticalblock109,
                     (string *)local_158);
          if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if (criticalblock109.super_unique_lock._M_device != (mutex_type *)local_128) {
            operator_delete(criticalblock109.super_unique_lock._M_device,
                            (ulong)(local_128._0_8_ + 1));
          }
        }
        iVar8 = 1;
        ProcessValidTx(this,peVar5->m_id,&porphanTx,
                       (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)((long)&poll_result.
                                  super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                  .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                  _M_payload + 0x50));
      }
      else {
        iVar8 = 0;
        if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
            super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
            super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_ != 5) {
          pLVar7 = LogInstance();
          bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar7,TXPACKAGES,Debug);
          if (bVar6) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock109,this_00);
            base_blob<256u>::ToString_abi_cxx11_((string *)local_158,this_01);
            ValidationState<TxValidationResult>::ToString_abi_cxx11_
                      (&local_178,
                       (ValidationState<TxValidationResult> *)
                       ((long)&poll_result.
                               super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                               _M_payload.
                               super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                               .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                               _M_payload._M_value.first + 8));
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file._M_len = 0x62;
            logging_function._M_str = "ProcessOrphanTx";
            logging_function._M_len = 0xf;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string>
                      (logging_function,source_file,0xd64,TXPACKAGES,Debug,
                       (ConstevalFormatString<4U>)0xf9f727,(string *)&criticalblock109,
                       (string *)local_158,&peVar5->m_id,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              (ulong)(local_178.field_2._M_allocated_capacity + 1));
            }
            if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            if (criticalblock109.super_unique_lock._M_device != (mutex_type *)local_128) {
              operator_delete(criticalblock109.super_unique_lock._M_device,
                              (ulong)(local_128._0_8_ + 1));
            }
          }
          iVar8 = 1;
          if ((poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
               _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
               super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ == 1) &&
             ((0xd < (uint)poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _12_4_ ||
              ((0x2801U >>
                (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                 super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_ &
                0x1f) & 1) == 0)))) {
            ProcessInvalidTx(this,peVar5->m_id,&porphanTx,
                             (TxValidationState *)
                             ((long)&poll_result.
                                     super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                     .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                     _M_payload._M_value.first + 8),false);
          }
        }
      }
      if ((local_68 == true) &&
         (local_68 = false,
         local_80._M_value.
         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_80._M_value.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - local_80._0_8_);
      }
      std::__cxx11::
      _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)((long)&poll_result.
                            super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                            .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload
                    + 0x50));
      if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
          super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
          super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
          m_type._M_dataplus._M_p !=
          (pointer)((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload +
                   0x40)) {
        operator_delete((void *)poll_result.
                                super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                                _M_payload.
                                super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                _M_payload._M_value.first.m_type._M_dataplus._M_p,
                        poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                        super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                        _64_8_ + 1);
      }
      if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
          super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
          super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
          m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          (pointer)((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload +
                   0x20)) {
        operator_delete(poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                        super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                        _M_value.first.m_recv.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,
                        (long)poll_result.
                              super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                              .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                              _M_payload._M_value.first.m_time.__r + 1);
      }
    }
    if (porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  } while (iVar8 == 0);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  peVar5 = peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = (pfrom->fDisconnect)._M_base._M_i;
  if (iVar8 != 3 || (_Var1 & 1U) != 0) {
    bVar9 = _Var1 ^ 1;
    goto LAB_008f73eb;
  }
  poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_recv.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_getdata_requests_mutex;
  poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ =
       poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
       super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
       super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ & 0xffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&poll_result);
  pCVar3 = (peVar5->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pCVar4 = (peVar5->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&poll_result);
  bVar9 = 1;
  if (pCVar3 != pCVar4) goto LAB_008f73eb;
  if (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0) goto LAB_008f73e8;
  CNode::PollMessage(&poll_result,pfrom);
  if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged == false) {
LAB_008f74b0:
    bVar9 = 0;
  }
  else {
    if ((this->m_opts).capture_messages == true) {
      __args_2.m_data =
           poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
           super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
           m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start +
           poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
           super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
           m_recv.m_read_pos;
      __args_2.m_size =
           CONCAT44(poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_,
                    poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_) -
           (long)__args_2.m_data;
      std::
      function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
      ::operator()(&CaptureMessage_abi_cxx11_,&pfrom->addr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _M_value.first + 0x30),__args_2,true);
    }
    ProcessMessage(this,pfrom,
                   (string *)
                   ((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _M_value.first + 0x30),(DataStream *)&poll_result,
                   poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                   super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.
                   first.m_time.__r,interruptMsgProc);
    if (((interruptMsgProc->_M_base)._M_i & 1U) != 0) goto LAB_008f74b0;
    criticalblock109.super_unique_lock._M_device =
         &((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->m_getdata_requests_mutex).super_mutex;
    criticalblock109.super_unique_lock._M_owns = false;
    std::unique_lock<std::mutex>::lock(&criticalblock109.super_unique_lock);
    uVar10 = 1;
    if (((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      uVar10 = poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
               _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
               super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.
               second;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock109.super_unique_lock);
    criticalblock109.super_unique_lock._M_owns = false;
    criticalblock109.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&criticalblock109.super_unique_lock);
    bVar6 = TxOrphanage::HaveTxToReconsider
                      (&this->m_orphanage,
                       (peer.
                        super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_id);
    bVar9 = 1;
    if (!bVar6) {
      bVar9 = uVar10;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock109.super_unique_lock);
  }
  if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged == true) {
    std::_Optional_payload_base<std::pair<CNetMessage,_bool>_>::_M_destroy
              ((_Optional_payload_base<std::pair<CNetMessage,_bool>_> *)&poll_result);
  }
LAB_008f73eb:
  if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(bVar9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::ProcessMessages(CNode* pfrom, std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(m_tx_download_mutex);
    AssertLockHeld(g_msgproc_mutex);

    PeerRef peer = GetPeerRef(pfrom->GetId());
    if (peer == nullptr) return false;

    // For outbound connections, ensure that the initial VERSION message
    // has been sent first before processing any incoming messages
    if (!pfrom->IsInboundConn() && !peer->m_outbound_version_message_sent) return false;

    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) {
            ProcessGetData(*pfrom, *peer, interruptMsgProc);
        }
    }

    const bool processed_orphan = ProcessOrphanTx(*peer);

    if (pfrom->fDisconnect)
        return false;

    if (processed_orphan) return true;

    // this maintains the order of responses
    // and prevents m_getdata_requests to grow unbounded
    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) return true;
    }

    // Don't bother if send buffer is too full to respond anyway
    if (pfrom->fPauseSend) return false;

    auto poll_result{pfrom->PollMessage()};
    if (!poll_result) {
        // No message to process
        return false;
    }

    CNetMessage& msg{poll_result->first};
    bool fMoreWork = poll_result->second;

    TRACE6(net, inbound_message,
        pfrom->GetId(),
        pfrom->m_addr_name.c_str(),
        pfrom->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.m_recv.size(),
        msg.m_recv.data()
    );

    if (m_opts.capture_messages) {
        CaptureMessage(pfrom->addr, msg.m_type, MakeUCharSpan(msg.m_recv), /*is_incoming=*/true);
    }

    try {
        ProcessMessage(*pfrom, msg.m_type, msg.m_recv, msg.m_time, interruptMsgProc);
        if (interruptMsgProc) return false;
        {
            LOCK(peer->m_getdata_requests_mutex);
            if (!peer->m_getdata_requests.empty()) fMoreWork = true;
        }
        // Does this peer has an orphan ready to reconsider?
        // (Note: we may have provided a parent for an orphan provided
        //  by another peer that was already processed; in that case,
        //  the extra work may not be noticed, possibly resulting in an
        //  unnecessary 100ms delay)
        LOCK(m_tx_download_mutex);
        if (m_orphanage.HaveTxToReconsider(peer->m_id)) fMoreWork = true;
    } catch (const std::exception& e) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Exception '%s' (%s) caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size, e.what(), typeid(e).name());
    } catch (...) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Unknown exception caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size);
    }

    return fMoreWork;
}